

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
::set_ctrl(raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
           *this,size_t i,ctrl_t h)

{
  bool bVar1;
  ctrl_t h_local;
  size_t i_local;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  *this_local;
  
  if (i < this->capacity_) {
    bVar1 = IsFull(h);
    if (bVar1) {
      SanitizerUnpoisonObject<phmap::priv::map_slot_type<Key<1ul>,unsigned_int>>(this->slots_ + i);
    }
    else {
      SanitizerPoisonObject<phmap::priv::map_slot_type<Key<1ul>,unsigned_int>>(this->slots_ + i);
    }
    this->ctrl_[i] = h;
    this->ctrl_[(i - 0x10 & this->capacity_) + 1 + (this->capacity_ & 0xf)] = h;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x8fb,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1>, unsigned int>, Key<1>::Hash, phmap::EqualTo<Key<1>>, std::allocator<std::pair<const Key<1>, unsigned int>>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::FlatHashMapPolicy<Key<1>, unsigned int>, Hash = Key<1>::Hash, Eq = phmap::EqualTo<Key<1>>, Alloc = std::allocator<std::pair<const Key<1>, unsigned int>>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h) {
        assert(i < capacity_);

        if (IsFull(h)) {
            SanitizerUnpoisonObject(slots_ + i);
        } else {
            SanitizerPoisonObject(slots_ + i);
        }

        ctrl_[i] = h;
        ctrl_[((i - Group::kWidth) & capacity_) + 1 +
              ((Group::kWidth - 1) & capacity_)] = h;
    }